

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile-time-zero-delay-observer.hxx
# Opt level: O3

StateVector * __thiscall
stateObservation::compileTime::ZeroDelayObserver<4U,_3U,_1U>::getEstimatedState
          (StateVector *__return_storage_ptr__,ZeroDelayObserver<4U,_3U,_1U> *this,uint k)

{
  uint *puVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  byte bVar5;
  int iVar6;
  bool bVar7;
  undefined1 auStack_58 [40];
  
  bVar5 = (this->x_).isSet_;
  if ((bool)bVar5 != false) {
    puVar1 = &(this->x_).k_;
    bVar7 = k < *puVar1;
    iVar6 = k - *puVar1;
    if (bVar7) {
      __assert_fail("k0<=k && \"ERROR: The observer cannot estimate previous states\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/observer/compile-time/compile-time-zero-delay-observer.hxx"
                    ,0x4a,
                    "virtual typename ObserverBase<n, m, p>::StateVector stateObservation::compileTime::ZeroDelayObserver<4, 3, 1>::getEstimatedState(unsigned int) [n = 4, m = 3, p = 1]"
                   );
    }
    if (!bVar7 && iVar6 != 0) {
      do {
        (*(this->super_ObserverBase<4U,_3U,_1U>)._vptr_ObserverBase[0xb])(auStack_58,this);
        std::
        deque<stateObservation::compileTime::IndexedMatrix<3U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<3U,_1U>_>_>
        ::pop_front(&this->y_);
        std::
        deque<stateObservation::compileTime::IndexedMatrix<1U,_1U>,_Eigen::aligned_allocator<stateObservation::compileTime::IndexedMatrix<1U,_1U>_>_>
        ::pop_front(&this->u_);
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
      bVar5 = (this->x_).isSet_;
    }
    if ((bVar5 & 1) != 0) {
      dVar2 = (this->x_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
              m_data.array[0];
      dVar3 = (this->x_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
              m_data.array[1];
      dVar4 = (this->x_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
              m_data.array[3];
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
      m_storage.m_data.array[2] =
           (this->x_).v_.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
           m_data.array[2];
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
      m_storage.m_data.array[3] = dVar4;
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
      m_storage.m_data.array[0] = dVar2;
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
      m_storage.m_data.array[1] = dVar3;
      return __return_storage_ptr__;
    }
  }
  __assert_fail("isSet_ && \"Error : Matrix not initialized\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/observer/compile-time/compile-time-observer-base.hxx"
                ,0x3e,
                "void stateObservation::compileTime::IndexedMatrix<4, 1>::check_() const [r = 4, c = 1]"
               );
}

Assistant:

void ZeroDelayObserver<n,m,p>::clearInputs()
{
    if (p>0)
        u_.clear();
}